

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O1

int __thiscall QuantizeData::update_histogram(QuantizeData *this,Mat *data)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  pointer pfVar5;
  uint uVar6;
  void *pvVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  
  iVar2 = data->c;
  if (0 < (long)iVar2) {
    uVar6 = data->h * data->w;
    pvVar7 = data->data;
    sVar3 = data->cstep;
    sVar4 = data->elemsize;
    lVar9 = 0;
    do {
      if (0 < (int)uVar6) {
        pfVar5 = (this->histogram).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = 0;
        do {
          fVar1 = *(float *)((long)pvVar7 + uVar10 * 4);
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            iVar8 = (int)(ABS(fVar1) / this->histogram_interval);
            if (0x7fe < iVar8) {
              iVar8 = 0x7ff;
            }
            pfVar5[iVar8] = pfVar5[iVar8] + 1.0;
          }
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
      lVar9 = lVar9 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar3 * sVar4);
    } while (lVar9 != iVar2);
  }
  return 0;
}

Assistant:

int QuantizeData::update_histogram(ncnn::Mat data)
{
    int channel_num = data.c;
    int size = data.w * data.h;

    for (int q=0; q<channel_num; q++)
    {
        const float *data_n = data.channel(q);
        for(int i=0; i<size; i++)
        {
            if (data_n[i] == 0)
                continue;

            int index = std::min(static_cast<int>(std::abs(data_n[i]) / histogram_interval), 2047);

            histogram[index]++;
        }
    }        

    return 0;
}